

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O3

void ParseOldDecoration(FScanner *sc,EDefinitionType def)

{
  uint *puVar1;
  double dVar2;
  PClassActor *cls;
  BYTE *pBVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  PInt *pPVar6;
  hash_t hVar7;
  bool bVar8;
  undefined2 uVar9;
  WORD WVar10;
  int iVar11;
  uint uVar12;
  ClassReg *pCVar13;
  PClassActor *info;
  FState *pFVar14;
  WORD *pWVar15;
  FScanner *sc_00;
  FScanner *sc_01;
  FScanner *sc_02;
  FScanner *sc_03;
  EDefinitionType EVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  FState *pFVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar30;
  undefined1 auVar24 [16];
  int iVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar62;
  int iVar63;
  int iVar67;
  undefined1 auVar64 [16];
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar71 [16];
  TArray<FState,_FState> StateArray;
  FExtraInfo extra;
  char sprite [5];
  FState icecopy;
  Baggage bag;
  undefined1 local_148 [104];
  int local_e0;
  int local_dc;
  undefined1 local_d8 [16];
  DObject *local_c8;
  undefined8 uStack_c0;
  PField **local_b8;
  _func_int **local_b0;
  FName local_a8;
  FName local_a4;
  Baggage local_a0;
  
  local_a0.ClassName.Chars = FString::NullString.Nothing;
  local_a0.statedef.StateArray.Array = (FState *)0x0;
  local_a0.statedef.StateArray.Most = 0;
  local_a0.statedef.StateArray.Count = 0;
  local_a0.statedef.StateLabels.Array = (FStateDefine *)0x0;
  local_a0.statedef.StateLabels.Most = 0;
  local_a0.statedef.StateLabels.Count = 0;
  local_a0.statedef.laststate = (FState *)0x0;
  local_a0.statedef.laststatebeforelabel = (FState *)0x0;
  local_a0.statedef.lastlabel = -1;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_a0.ScriptPosition.FileName.Chars = FString::NullString.Nothing;
  local_a0.ScriptPosition.ScriptLine = 0;
  local_148._0_8_ = (FState *)0x0;
  local_148._8_8_ = (PClass *)0x0;
  if (def == DEF_Pickup) {
    pCVar13 = &AFakeInventory::RegistrationInfo;
  }
  else {
    pCVar13 = &AActor::RegistrationInfo;
  }
  cls = (PClassActor *)pCVar13->MyClass;
  FScanner::MustGetString(sc);
  local_dc = FName::NameManager::FindName(&FName::NameData,sc->String,false);
  local_a4.Index = local_dc;
  info = (PClassActor *)
         PClass::CreateDerivedClass
                   ((PClass *)cls,&local_a4,
                    *(uint *)&(cls->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType
                              .super_PType.super_DObject.field_0x24);
  local_a0.DropItemList = (DDropItem *)0x0;
  local_a0.DropItemSet = false;
  local_a0.StateSet = false;
  local_a0.CurrentState = 0;
  FStateDefinitions::MakeStateDefines(&local_a0.statedef,cls);
  local_a0.Info = info;
  FString::operator=(&local_a0.ClassName,
                     FName::NameData.NameArray
                     [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
  info->GameFilter = '\0';
  FScanner::MustGetStringName(sc,"{");
  local_148._64_8_ = (Node *)0x0;
  local_148._72_8_ = (Node *)0x0;
  local_148._48_8_ = (PType *)0x0;
  local_148._56_8_ = (PSymbolTable *)0x0;
  local_148._32_8_ = 0;
  local_148._40_8_ = 0;
  local_148._16_8_ = (DObject *)0x0;
  local_148._24_8_ = (DObject *)0x0;
  pBVar3 = (info->super_PClass).Defaults;
  local_148[0x54] = 0;
  local_148._80_4_ = 0x31544e54;
  FScanner::MustGetString(sc);
  bVar8 = FScanner::Compare(sc,"}");
  if (!bVar8) {
    EVar16 = def | DEF_Pickup;
    local_b0 = (_func_int **)&PTR__FxConstant_0088f2f0;
    do {
      bVar8 = FScanner::Compare(sc,"DoomEdNum");
      if (bVar8) {
        FScanner::MustGetNumber(sc);
        iVar11 = sc->Number;
        if (iVar11 - 0x8000U < 0xffff7fff) {
          FScanner::ScriptError(sc,"DoomEdNum must be in the range [-1,32767]");
          iVar11 = sc->Number;
        }
        (local_a0.Info)->DoomEdNum = (SWORD)iVar11;
        hVar7 = local_148._80_4_;
      }
      else {
        bVar8 = FScanner::Compare(sc,"SpawnNum");
        if (bVar8) {
          FScanner::MustGetNumber(sc);
          uVar12 = sc->Number;
          if (0xff < uVar12) {
            FScanner::ScriptError(sc,"SpawnNum must be in the range [0,255]");
            uVar12 = sc->Number;
          }
          (local_a0.Info)->SpawnID = (ushort)uVar12 & 0xff;
          hVar7 = local_148._80_4_;
        }
        else {
          bVar8 = FScanner::Compare(sc,"Sprite");
          if (!bVar8) {
            if ((EVar16 != DEF_Projectile) || (bVar8 = FScanner::Compare(sc,"DeathSprite"), !bVar8))
            {
              bVar8 = FScanner::Compare(sc,"Frames");
              if (bVar8) {
                FScanner::MustGetString(sc);
                local_148._24_4_ = local_148._12_4_;
                ParseSpriteFrames((PClassActor *)local_148,(TArray<FState,_FState> *)sc,sc_00);
                local_148._28_4_ = local_148._12_4_;
                hVar7 = local_148._80_4_;
              }
              else if (EVar16 == DEF_Projectile) {
                bVar8 = FScanner::Compare(sc,"DeathFrames");
                if (bVar8) {
                  FScanner::MustGetString(sc);
                  local_148._32_4_ = local_148._12_4_;
                  ParseSpriteFrames((PClassActor *)local_148,(TArray<FState,_FState> *)sc,sc_01);
                  local_148._36_4_ = local_148._12_4_;
                  hVar7 = local_148._80_4_;
                }
                else {
                  if (def != DEF_BreakableDecoration) goto LAB_006637a0;
                  bVar8 = FScanner::Compare(sc,"IceDeathFrames");
                  if (bVar8) {
                    FScanner::MustGetString(sc);
                    local_148._40_4_ = local_148._12_4_;
                    ParseSpriteFrames((PClassActor *)local_148,(TArray<FState,_FState> *)sc,sc_02);
                    local_148._44_4_ = local_148._12_4_;
                    hVar7 = local_148._80_4_;
                  }
                  else {
                    bVar8 = FScanner::Compare(sc,"BurnDeathFrames");
                    if (bVar8) {
                      FScanner::MustGetString(sc);
                      local_148._48_4_ = local_148._12_4_;
                      ParseSpriteFrames((PClassActor *)local_148,(TArray<FState,_FState> *)sc,sc_03)
                      ;
                      local_148._52_4_ = local_148._12_4_;
                      hVar7 = local_148._80_4_;
                    }
                    else {
                      bVar8 = FScanner::Compare(sc,"GenericIceDeath");
                      if (bVar8) {
                        local_148[0x3c] = 1;
                        hVar7 = local_148._80_4_;
                      }
                      else {
                        bVar8 = FScanner::Compare(sc,"BurnsAway");
                        if (bVar8) {
                          local_148[0x3a] = 1;
                          hVar7 = local_148._80_4_;
                        }
                        else {
                          bVar8 = FScanner::Compare(sc,"DiesAway");
                          if (!bVar8) goto LAB_006637a0;
                          local_148[0x3b] = 1;
                          hVar7 = local_148._80_4_;
                        }
                      }
                    }
                  }
                }
              }
              else {
LAB_006637a0:
                bVar8 = FScanner::Compare(sc,"Alpha");
                if (bVar8) {
                  FScanner::MustGetFloat(sc);
                  dVar2 = sc->Float;
                  dVar32 = 1.0;
                  if (dVar2 <= 1.0) {
                    dVar32 = dVar2;
                  }
                  *(ulong *)(pBVar3 + 0xf8) = -(ulong)(0.0 < dVar2) & (ulong)dVar32;
                  hVar7 = local_148._80_4_;
                }
                else {
                  bVar8 = FScanner::Compare(sc,"Scale");
                  if (bVar8) {
                    FScanner::MustGetFloat(sc);
                    dVar2 = sc->Float;
                    *(double *)(pBVar3 + 0xe0) = dVar2;
                    *(double *)(pBVar3 + 0xd8) = dVar2;
                    hVar7 = local_148._80_4_;
                  }
                  else {
                    bVar8 = FScanner::Compare(sc,"RenderStyle");
                    if (bVar8) {
                      FScanner::MustGetString(sc);
                      iVar11 = FScanner::MustMatchString(sc,RenderStyles,8);
                      *(FRenderStyle *)(pBVar3 + 0xe8) = LegacyRenderStyles[iVar11];
                      hVar7 = local_148._80_4_;
                    }
                    else {
                      bVar8 = FScanner::Compare(sc,"Radius");
                      if (bVar8) {
                        FScanner::MustGetFloat(sc);
                        *(double *)(pBVar3 + 0x158) = sc->Float;
                        hVar7 = local_148._80_4_;
                      }
                      else {
                        bVar8 = FScanner::Compare(sc,"Height");
                        if (bVar8) {
                          FScanner::MustGetFloat(sc);
                          *(double *)(pBVar3 + 0x160) = sc->Float;
                          hVar7 = local_148._80_4_;
                        }
                        else if (def == DEF_BreakableDecoration) {
                          bVar8 = FScanner::Compare(sc,"DeathHeight");
                          if (bVar8) {
                            FScanner::MustGetFloat(sc);
                            local_148._64_8_ = sc->Float;
                            hVar7 = local_148._80_4_;
                          }
                          else {
                            bVar8 = FScanner::Compare(sc,"BurnHeight");
                            if (bVar8) {
                              FScanner::MustGetFloat(sc);
                              local_148._72_8_ = sc->Float;
                              hVar7 = local_148._80_4_;
                            }
                            else {
                              bVar8 = FScanner::Compare(sc,"Health");
                              if (!bVar8) goto LAB_00663b68;
                              FScanner::MustGetNumber(sc);
                              *(int *)(pBVar3 + 0x1cc) = sc->Number;
                              hVar7 = local_148._80_4_;
                            }
                          }
                        }
                        else if (def == DEF_Projectile) {
                          bVar8 = FScanner::Compare(sc,"ExplosionRadius");
                          if (bVar8) {
                            FScanner::MustGetNumber(sc);
                            (local_a0.Info)->ExplosionRadius = sc->Number;
                          }
                          else {
                            bVar8 = FScanner::Compare(sc,"ExplosionDamage");
                            if (!bVar8) {
                              bVar8 = FScanner::Compare(sc,"DoNotHurtShooter");
                              if (bVar8) {
                                (local_a0.Info)->DontHurtShooter = true;
                                hVar7 = local_148._80_4_;
                              }
                              else {
                                bVar8 = FScanner::Compare(sc,"Damage");
                                if (bVar8) {
                                  FScanner::MustGetNumber(sc);
                                  local_148._96_8_ = operator_new(0x50);
                                  local_148._88_8_ = operator_new(0x48);
                                  local_e0 = sc->Number;
                                  FScriptPosition::FScriptPosition((FScriptPosition *)local_d8,sc);
                                  FxExpression::FxExpression
                                            ((FxExpression *)local_148._88_8_,
                                             (FScriptPosition *)local_d8);
                                  *(_func_int ***)local_148._88_8_ = local_b0;
                                  pPVar6 = TypeSInt32;
                                  ((FxExpression *)(local_148._88_8_ + 0x38))->_vptr_FxExpression =
                                       (_func_int **)TypeSInt32;
                                  *(PInt **)(local_148._88_8_ + 0x28) = pPVar6;
                                  *(int *)&(((FxExpression *)(local_148._88_8_ + 0x38))->
                                           JumpAddresses).Array = local_e0;
                                  *(bool *)(local_148._88_8_ + 0x30) = true;
                                  FxDamageValue::FxDamageValue
                                            ((FxDamageValue *)local_148._96_8_,
                                             (FxExpression *)local_148._88_8_,false);
                                  FString::~FString((FString *)local_d8);
                                  TArray<FxExpression_*,_FxExpression_*>::Grow
                                            (&ActorDamageFuncs.
                                              super_TArray<FxExpression_*,_FxExpression_*>,1);
                                  ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.
                                  Array[ActorDamageFuncs.
                                        super_TArray<FxExpression_*,_FxExpression_*>.Count] =
                                       (FxExpression *)local_148._96_8_;
                                  ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.
                                  Count = ActorDamageFuncs.
                                          super_TArray<FxExpression_*,_FxExpression_*>.Count + 1;
                                  *(ulong *)(pBVar3 + 0x180) =
                                       (ulong)ActorDamageFuncs.
                                              super_TArray<FxExpression_*,_FxExpression_*>.Count;
                                  hVar7 = local_148._80_4_;
                                }
                                else {
                                  bVar8 = FScanner::Compare(sc,"DamageType");
                                  if (bVar8) {
                                    FScanner::MustGetString(sc);
                                    bVar8 = FScanner::Compare(sc,"Normal");
                                    if (bVar8) {
                                      pBVar3[0x3c4] = '\0';
                                      pBVar3[0x3c5] = '\0';
                                      pBVar3[0x3c6] = '\0';
                                      pBVar3[0x3c7] = '\0';
                                      hVar7 = local_148._80_4_;
                                    }
                                    else {
                                      iVar11 = FName::NameManager::FindName
                                                         (&FName::NameData,sc->String,false);
                                      *(int *)(pBVar3 + 0x3c4) = iVar11;
                                      hVar7 = local_148._80_4_;
                                    }
                                  }
                                  else {
                                    bVar8 = FScanner::Compare(sc,"Speed");
                                    if (!bVar8) goto LAB_00663b68;
                                    FScanner::MustGetFloat(sc);
                                    *(double *)(pBVar3 + 0xc0) = sc->Float;
                                    hVar7 = local_148._80_4_;
                                  }
                                }
                              }
                              goto LAB_00663661;
                            }
                            FScanner::MustGetNumber(sc);
                            (local_a0.Info)->ExplosionDamage = sc->Number;
                          }
                          local_148[0x3d] = 1;
                          hVar7 = local_148._80_4_;
                        }
                        else {
LAB_00663b68:
                          bVar8 = FScanner::Compare(sc,"Mass");
                          if (bVar8) {
                            FScanner::MustGetFloat(sc);
                            *(int *)(pBVar3 + 0x3b8) = (int)sc->Float;
                            hVar7 = local_148._80_4_;
                          }
                          else {
                            bVar8 = FScanner::Compare(sc,"Translation1");
                            if (bVar8) {
                              FScanner::MustGetNumber(sc);
                              uVar12 = sc->Number;
                              if (2 < uVar12) {
                                FScanner::ScriptError(sc,"Translation1 must be in the range [0,2]");
                                uVar12 = sc->Number;
                              }
                              uVar12 = uVar12 | 0x30000;
                            }
                            else {
                              bVar8 = FScanner::Compare(sc,"Translation2");
                              if (!bVar8) {
                                if (EVar16 == DEF_Projectile) {
                                  bVar8 = FScanner::Compare(sc,"DeathSound");
                                  if (bVar8) {
                                    FScanner::MustGetString(sc);
                                    iVar11 = S_FindSound(sc->String);
                                    *(int *)(pBVar3 + 0x390) = iVar11;
                                    hVar7 = local_148._80_4_;
                                  }
                                  else {
                                    if (def != DEF_BreakableDecoration) goto LAB_00663ca2;
                                    bVar8 = FScanner::Compare(sc,"BurnDeathSound");
                                    if (bVar8) {
                                      FScanner::MustGetString(sc);
                                      iVar11 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 0x394) = iVar11;
                                      hVar7 = local_148._80_4_;
                                    }
                                    else {
                                      bVar8 = FScanner::Compare(sc,"SolidOnDeath");
                                      if (bVar8) {
                                        local_148[0x38] = 1;
                                        hVar7 = local_148._80_4_;
                                      }
                                      else {
                                        bVar8 = FScanner::Compare(sc,"SolidOnBurn");
                                        if (!bVar8) goto LAB_00663e48;
                                        local_148[0x39] = 1;
                                        hVar7 = local_148._80_4_;
                                      }
                                    }
                                  }
                                }
                                else {
LAB_00663ca2:
                                  if (def == DEF_Projectile) {
                                    bVar8 = FScanner::Compare(sc,"SpawnSound");
                                    if (bVar8) {
                                      FScanner::MustGetString(sc);
                                      iVar11 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 900) = iVar11;
                                      hVar7 = local_148._80_4_;
                                    }
                                    else {
                                      bVar8 = FScanner::Compare(sc,"DoomBounce");
                                      if (bVar8) {
                                        pBVar3[0x2a8] = 0xaf;
                                        pBVar3[0x2a9] = '\0';
                                        hVar7 = local_148._80_4_;
                                      }
                                      else {
                                        bVar8 = FScanner::Compare(sc,"HereticBounce");
                                        if (bVar8) {
                                          pBVar3[0x2a8] = 0xc6;
                                          pBVar3[0x2a9] = '\0';
                                          hVar7 = local_148._80_4_;
                                        }
                                        else {
                                          bVar8 = FScanner::Compare(sc,"HexenBounce");
                                          if (!bVar8) goto LAB_00663e48;
                                          pBVar3[0x2a8] = 0x8f;
                                          pBVar3[0x2a9] = '\0';
                                          hVar7 = local_148._80_4_;
                                        }
                                      }
                                    }
                                  }
                                  else if (def == DEF_Pickup) {
                                    bVar8 = FScanner::Compare(sc,"PickupSound");
                                    if (bVar8) {
                                      FScanner::MustGetString(sc);
                                      iVar11 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 0x4d8) = iVar11;
                                      hVar7 = local_148._80_4_;
                                    }
                                    else {
                                      bVar8 = FScanner::Compare(sc,"PickupMessage");
                                      if (bVar8) {
                                        FScanner::MustGetString(sc);
                                        FString::operator=((FString *)(local_a0.Info + 1),sc->String
                                                          );
                                        hVar7 = local_148._80_4_;
                                      }
                                      else {
                                        bVar8 = FScanner::Compare(sc,"Respawns");
                                        if (!bVar8) goto LAB_00663e48;
                                        pBVar3[0x4dc] = '\x01';
                                        hVar7 = local_148._80_4_;
                                      }
                                    }
                                  }
                                  else {
LAB_00663e48:
                                    if (*sc->String == '*') {
                                      FScanner::ScriptError(sc,(char *)0x0);
                                      hVar7 = local_148._80_4_;
                                    }
                                    else {
                                      HandleActorFlag(sc,&local_a0,sc->String,(char *)0x0,0x2b);
                                      hVar7 = local_148._80_4_;
                                    }
                                  }
                                }
                                goto LAB_00663661;
                              }
                              FScanner::MustGetNumber(sc);
                              uVar12 = sc->Number;
                              if (0xfffe < uVar12) {
                                FScanner::ScriptError
                                          (sc,
                                           "Translation2 must be in the range [0,MAX_ACS_TRANSLATIONS]"
                                          );
                                uVar12 = sc->Number;
                              }
                              uVar12 = uVar12 | 0x40000;
                            }
                            *(uint *)(pBVar3 + 0x380) = uVar12;
                            hVar7 = local_148._80_4_;
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_00663661;
            }
            local_148[0x10] = 1;
          }
          FScanner::MustGetString(sc);
          if (sc->StringLen != 4) {
            FScanner::ScriptError(sc,"Sprite name must be exactly four characters long");
          }
          hVar7 = *(hash_t *)sc->String;
          if (local_148[0x10] == '\x01') {
            local_148._16_4_ = *(hash_t *)sc->String;
            hVar7 = local_148._80_4_;
          }
        }
      }
LAB_00663661:
      local_148._80_4_ = hVar7;
      FScanner::MustGetString(sc);
      bVar8 = FScanner::Compare(sc,"}");
    } while (!bVar8);
  }
  iVar11 = GetSpriteIndex(local_148 + 0x50,true);
  auVar4 = _DAT_0073b300;
  uVar19 = (ulong)local_148._8_8_ >> 0x20;
  if (uVar19 != 0) {
    lVar17 = uVar19 - 1;
    auVar24._8_4_ = (int)lVar17;
    auVar24._0_8_ = lVar17;
    auVar24._12_4_ = (int)((ulong)lVar17 >> 0x20);
    lVar17 = 0;
    auVar24 = auVar24 ^ _DAT_0073b300;
    auVar70._8_4_ = 0xffffffff;
    auVar70._0_8_ = 0xffffffffffffffff;
    auVar70._12_4_ = 0xffffffff;
    auVar33 = _DAT_0073c180;
    auVar37 = _DAT_0073c190;
    auVar34 = _DAT_0073c1a0;
    auVar35 = _DAT_0073b2f0;
    do {
      auVar44 = auVar35 ^ auVar4;
      iVar63 = auVar24._0_4_;
      iVar62 = -(uint)(iVar63 < auVar44._0_4_);
      iVar30 = auVar24._4_4_;
      auVar45._4_4_ = -(uint)(iVar30 < auVar44._4_4_);
      iVar68 = auVar24._8_4_;
      iVar67 = -(uint)(iVar68 < auVar44._8_4_);
      iVar31 = auVar24._12_4_;
      auVar45._12_4_ = -(uint)(iVar31 < auVar44._12_4_);
      auVar56._4_4_ = iVar62;
      auVar56._0_4_ = iVar62;
      auVar56._8_4_ = iVar67;
      auVar56._12_4_ = iVar67;
      auVar69 = pshuflw(in_XMM11,auVar56,0xe8);
      auVar54._4_4_ = -(uint)(auVar44._4_4_ == iVar30);
      auVar54._12_4_ = -(uint)(auVar44._12_4_ == iVar31);
      auVar54._0_4_ = auVar54._4_4_;
      auVar54._8_4_ = auVar54._12_4_;
      auVar71 = pshuflw(in_XMM12,auVar54,0xe8);
      auVar45._0_4_ = auVar45._4_4_;
      auVar45._8_4_ = auVar45._12_4_;
      auVar44 = pshuflw(auVar69,auVar45,0xe8);
      auVar44 = (auVar44 | auVar71 & auVar69) ^ auVar70;
      auVar44 = packssdw(auVar44,auVar44);
      uVar9 = (undefined2)iVar11;
      if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)(local_148._0_8_ + 0x10) + lVar17) = uVar9;
      }
      auVar45 = auVar54 & auVar56 | auVar45;
      auVar44 = packssdw(auVar45,auVar45);
      auVar44 = packssdw(auVar44 ^ auVar70,auVar44 ^ auVar70);
      if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)&((FState *)(local_148._0_8_ + 0x28))->sprite + lVar17) = uVar9;
      }
      auVar54 = auVar34 ^ auVar4;
      iVar62 = -(uint)(iVar63 < auVar54._0_4_);
      auVar64._4_4_ = -(uint)(iVar30 < auVar54._4_4_);
      iVar67 = -(uint)(iVar68 < auVar54._8_4_);
      auVar64._12_4_ = -(uint)(iVar31 < auVar54._12_4_);
      auVar44._4_4_ = iVar62;
      auVar44._0_4_ = iVar62;
      auVar44._8_4_ = iVar67;
      auVar44._12_4_ = iVar67;
      auVar55._4_4_ = -(uint)(auVar54._4_4_ == iVar30);
      auVar55._12_4_ = -(uint)(auVar54._12_4_ == iVar31);
      auVar55._0_4_ = auVar55._4_4_;
      auVar55._8_4_ = auVar55._12_4_;
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar54 = auVar55 & auVar44 | auVar64;
      auVar54 = packssdw(auVar54,auVar54);
      auVar54 = packssdw(auVar54 ^ auVar70,auVar54 ^ auVar70);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&((FState *)(local_148._0_8_ + 0x50))->sprite + lVar17) = uVar9;
      }
      auVar44 = pshufhw(auVar44,auVar44,0x84);
      auVar56 = pshufhw(auVar55,auVar55,0x84);
      auVar45 = pshufhw(auVar44,auVar64,0x84);
      auVar44 = (auVar45 | auVar56 & auVar44) ^ auVar70;
      auVar44 = packssdw(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&((FState *)(local_148._0_8_ + 0x78))->sprite + lVar17) = uVar9;
      }
      auVar44 = auVar37 ^ auVar4;
      iVar62 = -(uint)(iVar63 < auVar44._0_4_);
      auVar47._4_4_ = -(uint)(iVar30 < auVar44._4_4_);
      iVar67 = -(uint)(iVar68 < auVar44._8_4_);
      auVar47._12_4_ = -(uint)(iVar31 < auVar44._12_4_);
      auVar57._4_4_ = iVar62;
      auVar57._0_4_ = iVar62;
      auVar57._8_4_ = iVar67;
      auVar57._12_4_ = iVar67;
      auVar54 = pshuflw(auVar54,auVar57,0xe8);
      auVar46._4_4_ = -(uint)(auVar44._4_4_ == iVar30);
      auVar46._12_4_ = -(uint)(auVar44._12_4_ == iVar31);
      auVar46._0_4_ = auVar46._4_4_;
      auVar46._8_4_ = auVar46._12_4_;
      in_XMM12 = pshuflw(auVar71 & auVar69,auVar46,0xe8);
      in_XMM12 = in_XMM12 & auVar54;
      auVar47._0_4_ = auVar47._4_4_;
      auVar47._8_4_ = auVar47._12_4_;
      auVar44 = pshuflw(auVar54,auVar47,0xe8);
      auVar44 = (auVar44 | in_XMM12) ^ auVar70;
      auVar44 = packssdw(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&((FState *)(local_148._0_8_ + 0xa0))->sprite + lVar17) = uVar9;
      }
      auVar47 = auVar46 & auVar57 | auVar47;
      auVar44 = packssdw(auVar47,auVar47);
      auVar44 = packssdw(auVar44 ^ auVar70,auVar44 ^ auVar70);
      if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&((FState *)(local_148._0_8_ + 200))->sprite + lVar17) = uVar9;
      }
      auVar44 = auVar33 ^ auVar4;
      iVar63 = -(uint)(iVar63 < auVar44._0_4_);
      auVar65._4_4_ = -(uint)(iVar30 < auVar44._4_4_);
      iVar68 = -(uint)(iVar68 < auVar44._8_4_);
      auVar65._12_4_ = -(uint)(iVar31 < auVar44._12_4_);
      auVar69._4_4_ = iVar63;
      auVar69._0_4_ = iVar63;
      auVar69._8_4_ = iVar68;
      auVar69._12_4_ = iVar68;
      auVar71._4_4_ = -(uint)(auVar44._4_4_ == iVar30);
      auVar71._12_4_ = -(uint)(auVar44._12_4_ == iVar31);
      auVar71._0_4_ = auVar71._4_4_;
      auVar71._8_4_ = auVar71._12_4_;
      auVar65._0_4_ = auVar65._4_4_;
      auVar65._8_4_ = auVar65._12_4_;
      auVar44 = auVar71 & auVar69 | auVar65;
      auVar44 = packssdw(auVar44,auVar44);
      in_XMM11 = packssdw(auVar44 ^ auVar70,auVar44 ^ auVar70);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&((FState *)(local_148._0_8_ + 0xf0))->sprite + lVar17) = uVar9;
      }
      auVar44 = pshufhw(auVar69,auVar69,0x84);
      auVar45 = pshufhw(auVar71,auVar71,0x84);
      auVar54 = pshufhw(auVar44,auVar65,0x84);
      auVar44 = (auVar54 | auVar45 & auVar44) ^ auVar70;
      auVar44 = packssdw(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&((FState *)(local_148._0_8_ + 0x118))->sprite + lVar17) = uVar9;
      }
      lVar18 = auVar35._8_8_;
      auVar35._0_8_ = auVar35._0_8_ + 8;
      auVar35._8_8_ = lVar18 + 8;
      lVar18 = auVar34._8_8_;
      auVar34._0_8_ = auVar34._0_8_ + 8;
      auVar34._8_8_ = lVar18 + 8;
      lVar18 = auVar37._8_8_;
      auVar37._0_8_ = auVar37._0_8_ + 8;
      auVar37._8_8_ = lVar18 + 8;
      lVar18 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + 8;
      auVar33._8_8_ = lVar18 + 8;
      lVar17 = lVar17 + 0x140;
    } while ((uVar19 * 8 + 0x38 & 0xffffffffffffffc0) * 5 != lVar17);
  }
  if ((local_148[0x10] != '\0') && (local_148._36_4_ != 0)) {
    iVar11 = GetSpriteIndex(local_148 + 0x10,true);
    auVar35 = _DAT_0073c1a0;
    auVar34 = _DAT_0073c190;
    auVar37 = _DAT_0073c180;
    auVar33 = _DAT_0073b300;
    auVar4 = _DAT_0073b2f0;
    if ((uint)local_148._32_4_ < (uint)local_148._36_4_) {
      lVar17 = (ulong)(uint)local_148._36_4_ - (local_148._32_8_ & 0xffffffff);
      lVar18 = lVar17 + -1;
      auVar25._8_4_ = (int)lVar18;
      auVar25._0_8_ = lVar18;
      auVar25._12_4_ = (int)((ulong)lVar18 >> 0x20);
      pWVar15 = &((FState *)(local_148._0_8_ + ((local_148._32_8_ & 0xffffffff) + 7) * 0x28))->
                 sprite;
      uVar19 = 0;
      auVar25 = auVar25 ^ _DAT_0073b300;
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      do {
        auVar42._8_4_ = (int)uVar19;
        auVar42._0_8_ = uVar19;
        auVar42._12_4_ = (int)(uVar19 >> 0x20);
        auVar24 = (auVar42 | auVar4) ^ auVar33;
        iVar63 = auVar25._0_4_;
        iVar62 = -(uint)(iVar63 < auVar24._0_4_);
        iVar30 = auVar25._4_4_;
        auVar49._4_4_ = -(uint)(iVar30 < auVar24._4_4_);
        iVar68 = auVar25._8_4_;
        iVar67 = -(uint)(iVar68 < auVar24._8_4_);
        iVar31 = auVar25._12_4_;
        auVar49._12_4_ = -(uint)(iVar31 < auVar24._12_4_);
        auVar58._4_4_ = iVar62;
        auVar58._0_4_ = iVar62;
        auVar58._8_4_ = iVar67;
        auVar58._12_4_ = iVar67;
        auVar70 = pshuflw(in_XMM11,auVar58,0xe8);
        auVar48._4_4_ = -(uint)(auVar24._4_4_ == iVar30);
        auVar48._12_4_ = -(uint)(auVar24._12_4_ == iVar31);
        auVar48._0_4_ = auVar48._4_4_;
        auVar48._8_4_ = auVar48._12_4_;
        auVar44 = pshuflw(in_XMM12,auVar48,0xe8);
        auVar49._0_4_ = auVar49._4_4_;
        auVar49._8_4_ = auVar49._12_4_;
        auVar24 = pshuflw(auVar70,auVar49,0xe8);
        auVar24 = (auVar24 | auVar44 & auVar70) ^ auVar41;
        auVar24 = packssdw(auVar24,auVar24);
        WVar10 = (WORD)iVar11;
        if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pWVar15[-0x8c] = WVar10;
        }
        auVar49 = auVar48 & auVar58 | auVar49;
        auVar24 = packssdw(auVar49,auVar49);
        auVar24 = packssdw(auVar24 ^ auVar41,auVar24 ^ auVar41);
        if ((auVar24._0_4_ >> 0x10 & 1) != 0) {
          pWVar15[-0x78] = WVar10;
        }
        auVar24 = (auVar42 | auVar35) ^ auVar33;
        iVar62 = -(uint)(iVar63 < auVar24._0_4_);
        auVar66._4_4_ = -(uint)(iVar30 < auVar24._4_4_);
        iVar67 = -(uint)(iVar68 < auVar24._8_4_);
        auVar66._12_4_ = -(uint)(iVar31 < auVar24._12_4_);
        auVar50._4_4_ = iVar62;
        auVar50._0_4_ = iVar62;
        auVar50._8_4_ = iVar67;
        auVar50._12_4_ = iVar67;
        auVar59._4_4_ = -(uint)(auVar24._4_4_ == iVar30);
        auVar59._12_4_ = -(uint)(auVar24._12_4_ == iVar31);
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar24 = auVar59 & auVar50 | auVar66;
        auVar24 = packssdw(auVar24,auVar24);
        auVar24 = packssdw(auVar24 ^ auVar41,auVar24 ^ auVar41);
        if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pWVar15[-100] = WVar10;
        }
        auVar54 = pshufhw(auVar50,auVar50,0x84);
        auVar56 = pshufhw(auVar59,auVar59,0x84);
        auVar45 = pshufhw(auVar54,auVar66,0x84);
        auVar54 = (auVar45 | auVar56 & auVar54) ^ auVar41;
        auVar54 = packssdw(auVar54,auVar54);
        if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pWVar15[-0x50] = WVar10;
        }
        auVar54 = (auVar42 | auVar34) ^ auVar33;
        iVar62 = -(uint)(iVar63 < auVar54._0_4_);
        auVar52._4_4_ = -(uint)(iVar30 < auVar54._4_4_);
        iVar67 = -(uint)(iVar68 < auVar54._8_4_);
        auVar52._12_4_ = -(uint)(iVar31 < auVar54._12_4_);
        auVar60._4_4_ = iVar62;
        auVar60._0_4_ = iVar62;
        auVar60._8_4_ = iVar67;
        auVar60._12_4_ = iVar67;
        auVar24 = pshuflw(auVar24,auVar60,0xe8);
        auVar51._4_4_ = -(uint)(auVar54._4_4_ == iVar30);
        auVar51._12_4_ = -(uint)(auVar54._12_4_ == iVar31);
        auVar51._0_4_ = auVar51._4_4_;
        auVar51._8_4_ = auVar51._12_4_;
        in_XMM12 = pshuflw(auVar44 & auVar70,auVar51,0xe8);
        in_XMM12 = in_XMM12 & auVar24;
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        auVar24 = pshuflw(auVar24,auVar52,0xe8);
        auVar24 = (auVar24 | in_XMM12) ^ auVar41;
        in_XMM11 = packssdw(auVar24,auVar24);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pWVar15[-0x3c] = WVar10;
        }
        auVar52 = auVar51 & auVar60 | auVar52;
        auVar24 = packssdw(auVar52,auVar52);
        auVar24 = packssdw(auVar24 ^ auVar41,auVar24 ^ auVar41);
        if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pWVar15[-0x28] = WVar10;
        }
        auVar24 = (auVar42 | auVar37) ^ auVar33;
        iVar63 = -(uint)(iVar63 < auVar24._0_4_);
        auVar61._4_4_ = -(uint)(iVar30 < auVar24._4_4_);
        iVar68 = -(uint)(iVar68 < auVar24._8_4_);
        auVar61._12_4_ = -(uint)(iVar31 < auVar24._12_4_);
        auVar53._4_4_ = iVar63;
        auVar53._0_4_ = iVar63;
        auVar53._8_4_ = iVar68;
        auVar53._12_4_ = iVar68;
        auVar43._4_4_ = -(uint)(auVar24._4_4_ == iVar30);
        auVar43._12_4_ = -(uint)(auVar24._12_4_ == iVar31);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar61._0_4_ = auVar61._4_4_;
        auVar61._8_4_ = auVar61._12_4_;
        auVar24 = auVar43 & auVar53 | auVar61;
        auVar24 = packssdw(auVar24,auVar24);
        auVar24 = packssdw(auVar24 ^ auVar41,auVar24 ^ auVar41);
        if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pWVar15[-0x14] = WVar10;
        }
        auVar70 = pshufhw(auVar53,auVar53,0x84);
        auVar24 = pshufhw(auVar43,auVar43,0x84);
        auVar44 = pshufhw(auVar70,auVar61,0x84);
        auVar24 = packssdw(auVar24 & auVar70,(auVar44 | auVar24 & auVar70) ^ auVar41);
        if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *pWVar15 = WVar10;
        }
        uVar19 = uVar19 + 8;
        pWVar15 = pWVar15 + 0xa0;
      } while ((lVar17 + 7U & 0xfffffffffffffff8) != uVar19);
    }
  }
  (local_a0.Info)->NumOwnedStates = local_148._12_4_;
  if (local_148._12_4_ == 0) {
    pcVar20 = "%s does not define any animation frames";
LAB_00663e8f:
    FScanner::ScriptError(sc,pcVar20,FName::NameData.NameArray[local_dc].Text);
  }
  else {
    if (local_148._28_4_ == 0) {
      pcVar20 = "%s does not have a Frames definition";
      goto LAB_00663e8f;
    }
    if ((def == DEF_BreakableDecoration) && (local_148._36_4_ == 0)) {
      pcVar20 = "%s does not have a DeathFrames definition";
      goto LAB_00663e8f;
    }
    if ((local_148._44_4_ != 0) && (local_148[0x3c] == '\x01')) {
      FScanner::ScriptError(sc,"You cannot use IceDeathFrames and GenericIceDeath together");
    }
  }
  if (local_148._44_4_ == 0) {
    iVar11 = info->NumOwnedStates;
  }
  else {
    uVar12 = local_148._44_4_ - 1;
    local_d8._0_8_ = ((FState *)(local_148._0_8_ + (ulong)uVar12 * 0x28))->NextState;
    local_d8._8_8_ = ((FState *)(local_148._0_8_ + (ulong)uVar12 * 0x28))->ActionFunc;
    local_c8 = *(DObject **)&((FState *)(local_148._0_8_ + (ulong)uVar12 * 0x28))->sprite;
    uStack_c0 = *(undefined8 *)(&((FState *)(local_148._0_8_ + (ulong)uVar12 * 0x28))->sprite + 4);
    local_b8 = *(PField ***)&((FState *)(local_148._0_8_ + (ulong)uVar12 * 0x28))->Light;
    TArray<FState,_FState>::Grow((TArray<FState,_FState> *)local_148,1);
    uVar19 = (ulong)(uint)local_148._12_4_;
    *(PField ***)&((FState *)(local_148._0_8_ + uVar19 * 0x28))->Light = local_b8;
    *(DObject **)&((FState *)(local_148._0_8_ + uVar19 * 0x28))->sprite = local_c8;
    *(undefined8 *)(&((FState *)(local_148._0_8_ + uVar19 * 0x28))->sprite + 4) = uStack_c0;
    ((FState *)(local_148._0_8_ + uVar19 * 0x28))->NextState = (FState *)local_d8._0_8_;
    ((FState *)(local_148._0_8_ + uVar19 * 0x28))->ActionFunc = (VMFunction *)local_d8._8_8_;
    local_148._12_4_ = local_148._12_4_ + 1;
    iVar11 = info->NumOwnedStates + 1;
    info->NumOwnedStates = iVar11;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)iVar11;
  uVar19 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar19 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  pFVar14 = (FState *)operator_new__(uVar19);
  info->OwnedStates = pFVar14;
  memcpy(pFVar14,(void *)local_148._0_8_,(long)info->NumOwnedStates * 0x28);
  auVar33 = _DAT_0073b300;
  auVar4 = _DAT_0073b2f0;
  if (info->NumOwnedStates == 1) {
    pFVar14 = info->OwnedStates;
    pFVar14->Tics = -1;
    pFVar14->TicRange = 0;
    pFVar14->Misc1 = 0;
  }
  else {
    uVar22 = local_148._24_8_ & 0xffffffff;
    uVar12 = local_148._28_4_ - 1;
    pFVar14 = info->OwnedStates;
    uVar19 = uVar22;
    if ((uint)local_148._24_4_ < uVar12) {
      lVar17 = uVar12 - uVar22;
      lVar18 = lVar17 + -1;
      auVar26._8_4_ = (int)lVar18;
      auVar26._0_8_ = lVar18;
      auVar26._12_4_ = (int)((ulong)lVar18 >> 0x20);
      pFVar21 = pFVar14 + uVar22 + 1;
      uVar23 = 0;
      auVar26 = auVar26 ^ _DAT_0073b300;
      do {
        auVar36._8_4_ = (int)uVar23;
        auVar36._0_8_ = uVar23;
        auVar36._12_4_ = (int)(uVar23 >> 0x20);
        auVar37 = (auVar36 | auVar4) ^ auVar33;
        if ((bool)(~(auVar37._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar37._0_4_ ||
                    auVar26._4_4_ < auVar37._4_4_) & 1)) {
          pFVar21[-1].NextState = pFVar21;
        }
        if ((auVar37._12_4_ != auVar26._12_4_ || auVar37._8_4_ <= auVar26._8_4_) &&
            auVar37._12_4_ <= auVar26._12_4_) {
          pFVar21->NextState = pFVar21 + 1;
        }
        uVar23 = uVar23 + 2;
        pFVar21 = pFVar21 + 2;
        uVar19 = (ulong)uVar12;
      } while ((lVar17 + 1U & 0xfffffffffffffffe) != uVar23);
    }
    pFVar14[uVar19].NextState = pFVar14 + uVar22;
    auVar33 = _DAT_0073b300;
    auVar4 = _DAT_0073b2f0;
    if (local_148._36_4_ != 0) {
      uVar22 = local_148._32_8_ & 0xffffffff;
      uVar12 = local_148._36_4_ - 1;
      uVar19 = uVar22;
      if ((uint)local_148._32_4_ < uVar12) {
        lVar17 = uVar12 - uVar22;
        lVar18 = lVar17 + -1;
        auVar27._8_4_ = (int)lVar18;
        auVar27._0_8_ = lVar18;
        auVar27._12_4_ = (int)((ulong)lVar18 >> 0x20);
        pFVar21 = pFVar14 + uVar22 + 1;
        uVar23 = 0;
        auVar27 = auVar27 ^ _DAT_0073b300;
        do {
          auVar38._8_4_ = (int)uVar23;
          auVar38._0_8_ = uVar23;
          auVar38._12_4_ = (int)(uVar23 >> 0x20);
          auVar37 = (auVar38 | auVar4) ^ auVar33;
          if ((bool)(~(auVar37._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar37._0_4_ ||
                      auVar27._4_4_ < auVar37._4_4_) & 1)) {
            pFVar21[-1].NextState = pFVar21;
          }
          if ((auVar37._12_4_ != auVar27._12_4_ || auVar37._8_4_ <= auVar27._8_4_) &&
              auVar37._12_4_ <= auVar27._12_4_) {
            pFVar21->NextState = pFVar21 + 1;
          }
          uVar23 = uVar23 + 2;
          pFVar21 = pFVar21 + 2;
          uVar19 = (ulong)uVar12;
        } while ((lVar17 + 1U & 0xfffffffffffffffe) != uVar23);
      }
      if ((def == DEF_Projectile) || (local_148[0x3b] != '\0')) {
        pFVar14[uVar19].NextState = (FState *)0x0;
        if (def != DEF_Projectile) goto LAB_006641d6;
        if (local_148[0x3d] == '\x01') {
          FState::SetAction(pFVar14 + uVar22,"A_Explode");
        }
      }
      else {
        pFVar14[uVar19].Tics = -1;
        pFVar14[uVar19].TicRange = 0;
        pFVar14[uVar19].Misc1 = 0;
LAB_006641d6:
        FState::SetAction(pFVar14 + uVar22,"A_Scream");
        if (local_148[0x38] == '\0') {
          uVar12 = local_148._32_4_ + 1;
          uVar5 = local_148._32_4_;
          if (uVar12 < (uint)local_148._36_4_) {
            uVar5 = uVar12;
          }
          pcVar20 = "A_ScreamAndUnblock";
          if (uVar12 < (uint)local_148._36_4_) {
            pcVar20 = "A_NoBlocking";
          }
          FState::SetAction(info->OwnedStates + uVar5,pcVar20);
        }
        if (((double)local_148._64_8_ == 0.0) && (!NAN((double)local_148._64_8_))) {
          local_148._64_8_ = *(undefined8 *)((info->super_PClass).Defaults + 0x160);
        }
        info->DeathHeight = (double)local_148._64_8_;
      }
      FStateDefinitions::SetStateLabel
                (&local_a0.statedef,"Death",info->OwnedStates + (local_148._32_8_ & 0xffffffff),
                 '\x01');
    }
    auVar33 = _DAT_0073b300;
    auVar4 = _DAT_0073b2f0;
    if (local_148._52_4_ != 0) {
      uVar22 = local_148._48_8_ & 0xffffffff;
      uVar12 = local_148._52_4_ - 1;
      uVar19 = uVar22;
      if ((uint)local_148._48_4_ < uVar12) {
        lVar17 = uVar12 - uVar22;
        lVar18 = lVar17 + -1;
        auVar28._8_4_ = (int)lVar18;
        auVar28._0_8_ = lVar18;
        auVar28._12_4_ = (int)((ulong)lVar18 >> 0x20);
        pFVar14 = info->OwnedStates + uVar22 + 1;
        uVar23 = 0;
        auVar28 = auVar28 ^ _DAT_0073b300;
        do {
          auVar39._8_4_ = (int)uVar23;
          auVar39._0_8_ = uVar23;
          auVar39._12_4_ = (int)(uVar23 >> 0x20);
          auVar37 = (auVar39 | auVar4) ^ auVar33;
          if ((bool)(~(auVar37._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar37._0_4_ ||
                      auVar28._4_4_ < auVar37._4_4_) & 1)) {
            pFVar14[-1].NextState = pFVar14;
          }
          if ((auVar37._12_4_ != auVar28._12_4_ || auVar37._8_4_ <= auVar28._8_4_) &&
              auVar37._12_4_ <= auVar28._12_4_) {
            pFVar14->NextState = pFVar14 + 1;
          }
          uVar23 = uVar23 + 2;
          pFVar14 = pFVar14 + 2;
          uVar19 = (ulong)uVar12;
        } while ((lVar17 + 1U & 0xfffffffffffffffe) != uVar23);
      }
      pFVar14 = info->OwnedStates;
      if (local_148[0x3a] == '\x01') {
        pFVar14[uVar19].NextState = (FState *)0x0;
      }
      else {
        pFVar14[uVar19].Tics = -1;
        pFVar14[uVar19].TicRange = 0;
        pFVar14[uVar19].Misc1 = 0;
      }
      FState::SetAction(pFVar14 + uVar22,"A_ActiveSound");
      if (local_148[0x39] == '\0') {
        uVar12 = local_148._48_4_ + 1;
        uVar5 = local_148._48_4_;
        if (uVar12 < (uint)local_148._52_4_) {
          uVar5 = uVar12;
        }
        pcVar20 = "A_ActiveAndUnblock";
        if (uVar12 < (uint)local_148._52_4_) {
          pcVar20 = "A_NoBlocking";
        }
        FState::SetAction(info->OwnedStates + uVar5,pcVar20);
      }
      if (((double)local_148._72_8_ == 0.0) && (!NAN((double)local_148._72_8_))) {
        local_148._72_8_ = *(undefined8 *)((info->super_PClass).Defaults + 0x160);
      }
      info->BurnHeight = (double)local_148._72_8_;
      FStateDefinitions::SetStateLabel
                (&local_a0.statedef,"Burn",info->OwnedStates + (local_148._48_8_ & 0xffffffff),
                 '\x01');
    }
    auVar33 = _DAT_0073b300;
    auVar4 = _DAT_0073b2f0;
    if (local_148._44_4_ == 0) {
      if (local_148[0x3c] != '\x01') goto LAB_006645c0;
      local_a8.Index = 0x90;
      pFVar14 = PClassActor::FindState
                          ((PClassActor *)AActor::RegistrationInfo.MyClass,1,&local_a8,false);
    }
    else {
      uVar19 = local_148._40_8_ & 0xffffffff;
      uVar12 = local_148._44_4_ - 1;
      pFVar14 = info->OwnedStates;
      if ((uint)local_148._40_4_ < uVar12) {
        lVar17 = uVar12 - uVar19;
        lVar18 = lVar17 + -1;
        auVar29._8_4_ = (int)lVar18;
        auVar29._0_8_ = lVar18;
        auVar29._12_4_ = (int)((ulong)lVar18 >> 0x20);
        pFVar21 = pFVar14 + uVar19 + 1;
        uVar22 = 0;
        auVar29 = auVar29 ^ _DAT_0073b300;
        do {
          auVar40._8_4_ = (int)uVar22;
          auVar40._0_8_ = uVar22;
          auVar40._12_4_ = (int)(uVar22 >> 0x20);
          auVar37 = (auVar40 | auVar4) ^ auVar33;
          if ((bool)(~(auVar37._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar37._0_4_ ||
                      auVar29._4_4_ < auVar37._4_4_) & 1)) {
            pFVar21[-1].NextState = pFVar21;
          }
          if ((auVar37._12_4_ != auVar29._12_4_ || auVar37._8_4_ <= auVar29._8_4_) &&
              auVar37._12_4_ <= auVar29._12_4_) {
            pFVar21->NextState = pFVar21 + 1;
          }
          uVar22 = uVar22 + 2;
          pFVar21 = pFVar21 + 2;
          uVar19 = (ulong)uVar12;
        } while ((lVar17 + 1U & 0xfffffffffffffffe) != uVar22);
      }
      pFVar21 = pFVar14 + uVar19;
      pFVar21->NextState = pFVar14 + (long)info->NumOwnedStates + -1;
      pFVar21->Tics = 5;
      pFVar21->TicRange = 0;
      pFVar21->Misc1 = 0;
      FState::SetAction(pFVar21,"A_FreezeDeath");
      iVar11 = info->NumOwnedStates;
      pFVar14 = info->OwnedStates;
      pFVar21 = pFVar14 + (long)iVar11 + -1;
      pFVar21->NextState = pFVar21;
      pFVar14[(long)iVar11 + -1].Tics = 1;
      pFVar14[(long)iVar11 + -1].TicRange = 0;
      pFVar14[(long)iVar11 + -1].Misc1 = 0;
      FState::SetAction(pFVar21,"A_FreezeDeathChunks");
      pFVar14 = info->OwnedStates + (local_148._40_8_ & 0xffffffff);
    }
    FStateDefinitions::SetStateLabel(&local_a0.statedef,"Ice",pFVar14,'\x01');
  }
LAB_006645c0:
  if (def == DEF_BreakableDecoration) {
    uVar12 = 4;
  }
  else {
    if (def != DEF_Projectile) goto LAB_006645e3;
    uVar12 = 0x10400;
  }
  puVar1 = (uint *)((info->super_PClass).Defaults + 0x18c);
  *puVar1 = *puVar1 | uVar12;
LAB_006645e3:
  FStateDefinitions::SetStateLabel
            (&local_a0.statedef,"Spawn",info->OwnedStates + (local_148._24_8_ & 0xffffffff),'\x01');
  FStateDefinitions::InstallStates(&local_a0.statedef,info,(AActor *)(info->super_PClass).Defaults);
  TArray<FState,_FState>::~TArray((TArray<FState,_FState> *)local_148);
  FString::~FString(&local_a0.ScriptPosition.FileName);
  TArray<FState,_FState>::~TArray(&local_a0.statedef.StateArray);
  TArray<FStateDefine,_FStateDefine>::~TArray(&local_a0.statedef.StateLabels);
  FString::~FString(&local_a0.ClassName);
  return;
}

Assistant:

void ParseOldDecoration(FScanner &sc, EDefinitionType def)
{
	Baggage bag;
	TArray<FState> StateArray;
	FExtraInfo extra;
	PClassActor *type;
	PClassActor *parent;
	FName typeName;

	parent = (def == DEF_Pickup) ? RUNTIME_CLASS(AFakeInventory) : RUNTIME_CLASS(AActor);

	sc.MustGetString();
	typeName = FName(sc.String);
	type = static_cast<PClassActor *>(parent->CreateDerivedClass (typeName, parent->Size));
	ResetBaggage(&bag, parent);
	bag.Info = type;
#ifdef _DEBUG
	bag.ClassName = type->TypeName;
#endif

	type->GameFilter = GAME_Any;
	sc.MustGetStringName("{");

	memset (&extra, 0, sizeof(extra));
	ParseInsideDecoration (bag, (AActor *)(type->Defaults), extra, def, sc, StateArray);

	bag.Info->NumOwnedStates = StateArray.Size();
	if (bag.Info->NumOwnedStates == 0)
	{
		sc.ScriptError ("%s does not define any animation frames", typeName.GetChars() );
	}
	else if (extra.SpawnEnd == 0)
	{
		sc.ScriptError ("%s does not have a Frames definition", typeName.GetChars() );
	}
	else if (def == DEF_BreakableDecoration && extra.DeathEnd == 0)
	{
		sc.ScriptError ("%s does not have a DeathFrames definition", typeName.GetChars() );
	}
	else if (extra.IceDeathEnd != 0 && extra.bGenericIceDeath)
	{
		sc.ScriptError ("You cannot use IceDeathFrames and GenericIceDeath together");
	}

	if (extra.IceDeathEnd != 0)
	{
		// Make a copy of the final frozen frame for A_FreezeDeathChunks
		FState icecopy = StateArray[extra.IceDeathEnd-1];
		StateArray.Push (icecopy);
		type->NumOwnedStates += 1;
	}

	type->OwnedStates = new FState[type->NumOwnedStates];
	memcpy (type->OwnedStates, &StateArray[0], type->NumOwnedStates * sizeof(type->OwnedStates[0]));
	if (type->NumOwnedStates == 1)
	{
		type->OwnedStates->Tics = -1;
		type->OwnedStates->TicRange = 0;
		type->OwnedStates->Misc1 = 0;
	}
	else
	{
		size_t i;

		// Spawn states loop endlessly
		for (i = extra.SpawnStart; i < extra.SpawnEnd-1; ++i)
		{
			type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
		}
		type->OwnedStates[i].NextState = &type->OwnedStates[extra.SpawnStart];

		// Death states are one-shot and freeze on the final state
		if (extra.DeathEnd != 0)
		{
			for (i = extra.DeathStart; i < extra.DeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bDiesAway || def == DEF_Projectile)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			if (def == DEF_Projectile)
			{
				if (extra.bExplosive)
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_Explode");
				}
			}
			else
			{
				// The first frame plays the death sound and
				// the second frame makes it nonsolid.
				type->OwnedStates[extra.DeathStart].SetAction("A_Scream");
				if (extra.bSolidOnDeath)
				{
				}
				else if (extra.DeathStart + 1 < extra.DeathEnd)
				{
					type->OwnedStates[extra.DeathStart+1].SetAction("A_NoBlocking");
				}
				else
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_ScreamAndUnblock");
				}

				if (extra.DeathHeight == 0)
				{
					extra.DeathHeight = ((AActor*)(type->Defaults))->Height;
				}
				type->DeathHeight = extra.DeathHeight;
			}
			bag.statedef.SetStateLabel("Death", &type->OwnedStates[extra.DeathStart]);
		}

		// Burn states are the same as death states, except they can optionally terminate
		if (extra.FireDeathEnd != 0)
		{
			for (i = extra.FireDeathStart; i < extra.FireDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bBurnAway)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			// The first frame plays the burn sound and
			// the second frame makes it nonsolid.
			type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveSound");
			if (extra.bSolidOnBurn)
			{
			}
			else if (extra.FireDeathStart + 1 < extra.FireDeathEnd)
			{
				type->OwnedStates[extra.FireDeathStart+1].SetAction("A_NoBlocking");
			}
			else
			{
				type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveAndUnblock");
			}

			if (extra.BurnHeight == 0) extra.BurnHeight = ((AActor*)(type->Defaults))->Height;
			type->BurnHeight = extra.BurnHeight;

			bag.statedef.SetStateLabel("Burn", &type->OwnedStates[extra.FireDeathStart]);
		}

		// Ice states are similar to burn and death, except their final frame enters
		// a loop that eventually causes them to bust to pieces.
		if (extra.IceDeathEnd != 0)
		{
			for (i = extra.IceDeathStart; i < extra.IceDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			type->OwnedStates[i].NextState = &type->OwnedStates[type->NumOwnedStates-1];
			type->OwnedStates[i].Tics = 5;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeath");

			i = type->NumOwnedStates - 1;
			type->OwnedStates[i].NextState = &type->OwnedStates[i];
			type->OwnedStates[i].Tics = 1;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeathChunks");
			bag.statedef.SetStateLabel("Ice", &type->OwnedStates[extra.IceDeathStart]);
		}
		else if (extra.bGenericIceDeath)
		{
			bag.statedef.SetStateLabel("Ice", RUNTIME_CLASS(AActor)->FindState(NAME_GenericFreezeDeath));
		}
	}
	if (def == DEF_BreakableDecoration)
	{
		((AActor *)(type->Defaults))->flags |= MF_SHOOTABLE;
	}
	if (def == DEF_Projectile)
	{
		((AActor *)(type->Defaults))->flags |= MF_DROPOFF|MF_MISSILE;
	}
	bag.statedef.SetStateLabel("Spawn", &type->OwnedStates[extra.SpawnStart]);
	bag.statedef.InstallStates (type, ((AActor *)(type->Defaults)));
}